

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918Base.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)1>::install_field<8,6>
          (Base<(TI::TMS::Personality)1> *this,AddressT *target,uint8_t source)

{
  uint uVar1;
  size_t sVar2;
  AddressT mask;
  int source_mask;
  uint8_t source_local;
  AddressT *target_local;
  Base<(TI::TMS::Personality)1> *this_local;
  
  uVar1 = *target;
  sVar2 = memory_mask(V9938);
  *target = (uVar1 & 0xffffc0ff | (source & 0x3f) << 8) & (uint)sVar2;
  return;
}

Assistant:

void install_field(AddressT &target, uint8_t source) {
		static_assert(length > 0 && length <= 8);
		constexpr auto source_mask = (1 << length) - 1;
		constexpr auto mask = AddressT(~(source_mask << shift));
		target = (
			(target & mask) |
			AddressT((source & source_mask) << shift)
		) & memory_mask(personality);
	}